

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O1

void export_syms(symtbl_t *tbl)

{
  char *pcVar1;
  ulong uVar2;
  
  if (tbl->num_syms != 0) {
    uVar2 = 0;
    do {
      if ((tbl->syms[uVar2]->function == 0) && (tbl->scope_id == 0)) {
        fprintf((FILE *)f,".global %s\n");
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < tbl->num_syms);
  }
  if (tbl->num_syms != 0) {
    uVar2 = 0;
    do {
      if (tbl->syms[uVar2]->function == 0) {
        fprintf((FILE *)f,"%s:");
        pcVar1 = ".byte";
        if (tbl->syms[uVar2]->type_id == 0x85) {
          pcVar1 = ".word";
        }
        fprintf((FILE *)f," %s\n",pcVar1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < tbl->num_syms);
  }
  if (tbl->num_children != 0) {
    uVar2 = 0;
    do {
      export_syms(tbl->children[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < tbl->num_children);
  }
  return;
}

Assistant:

void export_syms(symtbl_t* tbl)
{
    unsigned int i;

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;
        if (tbl->scope_id == 0)
            fprintf(f, ".global %s\n", tbl->syms[i]->id);
    }

    for (i = 0; i < tbl->num_syms; ++i)
    {
        if (tbl->syms[i]->function)
            continue;

        fprintf(f, "%s:", tbl->syms[i]->id);
        fprintf(f, " %s\n", tbl->syms[i]->type_id == WORD ? ".word" : ".byte");
    }

    for (i = 0; i < tbl->num_children; i++)
        export_syms(tbl->children[i]);
}